

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPTimeInitializerObject::RTPTimeInitializerObject(RTPTimeInitializerObject *this)

{
  RTPTime::CurrentTime();
  this->dummy = -1;
  return;
}

Assistant:

RTPTimeInitializerObject::RTPTimeInitializerObject()
{
#ifdef RTPDEBUG
	std::cout << "RTPTimeInitializer: Initializing RTPTime::CurrentTime()" << std::endl;
#endif // RTPDEBUG
	RTPTime curtime = RTPTime::CurrentTime();
	JRTPLIB_UNUSED(curtime);
	dummy = -1;
}